

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynUnaryOpType GetUnaryOpType(LexemeType type)

{
  if ((int)type < 0x2a) {
    if (type == lex_add) {
      return SYN_UNARY_OP_PLUS;
    }
    if (type == lex_sub) {
      return SYN_UNARY_OP_NEGATE;
    }
  }
  else {
    if (type == lex_bitnot) {
      return SYN_UNARY_OP_BIT_NOT;
    }
    if (type == lex_lognot) {
      return SYN_UNARY_OP_LOGICAL_NOT;
    }
  }
  return SYN_UNARY_OP_UNKNOWN;
}

Assistant:

SynUnaryOpType GetUnaryOpType(LexemeType type)
{
	switch(type)
	{
	case lex_add:
		return SYN_UNARY_OP_PLUS;
	case lex_sub:
		return SYN_UNARY_OP_NEGATE;
	case lex_bitnot:
		return SYN_UNARY_OP_BIT_NOT;
	case lex_lognot:
		return SYN_UNARY_OP_LOGICAL_NOT;
	default:
		break;
	}

	return SYN_UNARY_OP_UNKNOWN;
}